

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O2

SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_false> * __thiscall
Js::SimpleDictionaryTypeHandlerBase<unsigned_short,Js::JavascriptString*,false>::
ConvertToTypeHandler<Js::SimpleDictionaryTypeHandlerBase<unsigned_short,Js::JavascriptString*,false>,Js::JavascriptString*>
          (SimpleDictionaryTypeHandlerBase<unsigned_short,Js::JavascriptString*,false> *this,
          DynamicObject *instance)

{
  char cVar1;
  SimpleDictionaryTypeHandlerBase<unsigned_short,Js::JavascriptString*,false> SVar2;
  Type TVar3;
  SimpleDictionaryPropertyDescriptor<unsigned_short> SVar4;
  Recycler *this_00;
  DynamicType *oldType;
  Type *pTVar5;
  BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
  *this_01;
  JavascriptString *propertyKey;
  code *pcVar6;
  bool bVar7;
  bool bVar8;
  PropertyTypes values;
  Recycler *alloc;
  SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_false> *this_02;
  undefined4 *puVar9;
  RecyclerWeakReference<Js::DynamicObject> *oldSingletonInstanceBefore;
  RecyclerWeakReference<Js::DynamicObject> *instance_00;
  SimpleDictionaryPropertyDescriptor<unsigned_short> *pSVar10;
  JavascriptString **ppJVar11;
  int index;
  byte bVar12;
  ushort uVar13;
  undefined1 local_a0 [8];
  TrackAllocData data;
  
  data._32_8_ = (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
                super_JavascriptLibraryBase).scriptContext.ptr;
  this_00 = ((ScriptContext *)data._32_8_)->recycler;
  local_a0 = (undefined1  [8])&typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_9cad258;
  data.filename._0_4_ = 0x1b2;
  alloc = Memory::Recycler::TrackAllocInfo(this_00,(TrackAllocData *)local_a0);
  this_02 = (SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_false> *)
            new<Memory::Recycler>(0x30,alloc,0x37a1d4);
  SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_false>::
  SimpleDictionaryTypeHandlerBase
            (this_02,this_00,*(int *)(this + 0xc),*(uint16 *)(this + 0x12),*(uint16 *)(this + 10),
             false,false);
  bVar7 = DynamicTypeHandler::GetHasOnlyWritableDataProperties((DynamicTypeHandler *)this_02);
  if (!bVar7) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x1b4,"(newTypeHandler->GetHasOnlyWritableDataProperties())",
                                "newTypeHandler->GetHasOnlyWritableDataProperties()");
    if (!bVar7) goto LAB_00c8d6cf;
    *puVar9 = 0;
  }
  oldType = (DynamicType *)(instance->super_RecyclableObject).type.ptr;
  oldSingletonInstanceBefore =
       SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_false>::
       GetSingletonInstance
                 ((SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_false> *)
                  this);
  SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_false>::
  TraceFixedFieldsBeforeTypeHandlerChange
            (L"SimpleDictionaryTypeHandler",L"[Simple]DictionaryTypeHandler",instance,
             (DynamicTypeHandler *)this,oldType,oldSingletonInstanceBefore);
  bVar7 = DynamicTypeHandler::CanBeSingletonInstance(instance);
  if (bVar7) {
    bVar7 = SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_false>::
            HasSingletonInstanceOnlyIfNeeded
                      ((SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_false>
                        *)this);
    if (!bVar7) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar9 = 1;
      bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                  ,0x1c4,"(HasSingletonInstanceOnlyIfNeeded())",
                                  "HasSingletonInstanceOnlyIfNeeded()");
      if (!bVar7) goto LAB_00c8d6cf;
      *puVar9 = 0;
    }
    bVar7 = DynamicTypeHandler::ShouldFixAnyProperties();
    if (bVar7) {
      instance_00 = *(RecyclerWeakReference<Js::DynamicObject> **)(this + 0x20);
      if ((instance_00 == (RecyclerWeakReference<Js::DynamicObject> *)0x0) ||
         ((DynamicObject *)(instance_00->super_RecyclerWeakReferenceBase).strongRef != instance)) {
        instance_00 = DynamicObject::CreateWeakReferenceToSelf(instance);
      }
      DynamicTypeHandler::SetSingletonInstance((DynamicTypeHandler *)this_02,instance_00);
    }
  }
  else if (*(long *)(this + 0x20) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x1bf,"(canBeSingletonInstance || !this->HasSingletonInstance())",
                                "canBeSingletonInstance || !this->HasSingletonInstance()");
    if (!bVar7) goto LAB_00c8d6cf;
    *puVar9 = 0;
  }
  pTVar5 = (instance->super_RecyclableObject).type.ptr;
  TVar3 = pTVar5->typeId;
  cVar1 = *(char *)&pTVar5[1].javascriptLibrary.ptr;
  SVar2 = this[9];
  if (((((byte)SVar2 & 0x18) != 0) && (((byte)SVar2 & 0x20) != 0)) && (DAT_0145c365 != '\0')) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x1d8,
                                "(!isOrMayBecomeShared || !IsolatePrototypes() || ((this->GetFlags() & IsPrototypeFlag) == 0))"
                                ,
                                "!isOrMayBecomeShared || !IsolatePrototypes() || ((this->GetFlags() & IsPrototypeFlag) == 0)"
                               );
    if (!bVar7) goto LAB_00c8d6cf;
    *puVar9 = 0;
  }
  if ((TVar3 == TypeIds_GlobalObject) || (cVar1 == '\0')) {
    bVar7 = true;
  }
  else {
    bVar7 = true;
    if ((((byte)this[9] & 0x20) == 0) && ((((byte)SVar2 & 0x18) == 0 || (DAT_0145c365 == '\x01'))))
    {
      bVar7 = Phases::IsEnabled((Phases *)&DAT_01436260,FixDataPropsPhase);
    }
  }
  puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  for (index = 0;
      this_01 = *(BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
                  **)(this + 0x18), index < this_01->count - this_01->freeCount; index = index + 1)
  {
    pSVar10 = JsUtil::
              BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
              ::GetValueAt(this_01,index);
    SVar4 = *pSVar10;
    ppJVar11 = JsUtil::
               BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
               ::GetKeyAt(*(BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
                            **)(this + 0x18),index);
    propertyKey = *ppJVar11;
    uVar13 = SVar4.propertyIndex;
    if (this_02->nextPropertyIndex < uVar13) {
      this_02->nextPropertyIndex = uVar13;
    }
    else if (this_02->nextPropertyIndex != uVar13) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar9 = 1;
      bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                  ,0x1ec,
                                  "(newTypeHandler->nextPropertyIndex == descriptor.propertyIndex)",
                                  "newTypeHandler->nextPropertyIndex == descriptor.propertyIndex");
      if (!bVar8) goto LAB_00c8d6cf;
      *puVar9 = 0;
    }
    bVar12 = SVar4._0_1_;
    if ((((byte)this[9] & 0x10) != 0) && (((uint)SVar4 & 4) != 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar9 = 1;
      bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                  ,0x1ee,"(!GetIsShared() || !descriptor.isFixed)",
                                  "!GetIsShared() || !descriptor.isFixed");
      if (!bVar8) goto LAB_00c8d6cf;
      *puVar9 = 0;
    }
    Add<Js::JavascriptString*>
              ((SimpleDictionaryTypeHandlerBase<unsigned_short,Js::JavascriptString*,false> *)
               this_02,propertyKey,SVar4.Attributes,(bool)((bVar12 & 2) >> 1),
               (bool)((bVar12 & 4) >> 2),(bool)((bVar12 & 8) >> 3 & bVar7),
               (ScriptContext *)data._32_8_);
  }
  this_02->nextPropertyIndex = *(Type *)(this + 0x2a);
  this_02->numDeletedProperties = (Type)this[0x29];
  SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_false>::
  ClearSingletonInstance
            ((SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_false> *)this)
  ;
  if (((this_02->super_DynamicTypeHandler).flags & 0x20) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    *puVar9 = 1;
    bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x1fc,"((newTypeHandler->GetFlags() & IsPrototypeFlag) == 0)",
                                "Why did we create a brand new type handler with a prototype flag set?"
                               );
    if (!bVar8) goto LAB_00c8d6cf;
    *puVar9 = 0;
  }
  DynamicTypeHandler::SetFlags((DynamicTypeHandler *)this_02,(byte)this[9] & 0x20);
  DynamicTypeHandler::ChangeFlags((DynamicTypeHandler *)this_02,0xc1,(BYTE)this[9]);
  if (((this_02->super_DynamicTypeHandler).propertyTypes & 0x40) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    *puVar9 = 1;
    bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x201,"(newTypeHandler->GetIsInlineSlotCapacityLocked())",
                                "newTypeHandler->GetIsInlineSlotCapacityLocked()");
    if (!bVar8) goto LAB_00c8d6cf;
    *puVar9 = 0;
  }
  values = DynamicTypeHandler::GetPropertyTypes((DynamicTypeHandler *)this);
  DynamicTypeHandler::SetPropertyTypes((DynamicTypeHandler *)this_02,0xb0,values);
  DynamicTypeHandler::SetInstanceTypeHandler((DynamicTypeHandler *)this_02,instance,true);
  if ((bVar7 == false) &&
     (((DynamicType *)(instance->super_RecyclableObject).type.ptr == oldType ||
      ((oldType->super_Type).typeId == TypeIds_GlobalObject)))) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    *puVar9 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x206,
                                "(transferUsedAsFixed || (instance->GetType() != oldType && oldType->GetTypeId() != TypeIds_GlobalObject))"
                                ,
                                "transferUsedAsFixed || (instance->GetType() != oldType && oldType->GetTypeId() != TypeIds_GlobalObject)"
                               );
    if (!bVar7) goto LAB_00c8d6cf;
    *puVar9 = 0;
  }
  if (((this_02->singletonInstance).ptr != (RecyclerWeakReference<Js::DynamicObject> *)0x0) &&
     (bVar7 = DynamicObject::HasSharedType(instance), bVar7)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    *puVar9 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x207,
                                "(!newTypeHandler->HasSingletonInstance() || !instance->HasSharedType())"
                                ,
                                "!newTypeHandler->HasSingletonInstance() || !instance->HasSharedType()"
                               );
    if (!bVar7) {
LAB_00c8d6cf:
      pcVar6 = (code *)invalidInstructionException();
      (*pcVar6)();
    }
    *puVar9 = 0;
  }
  SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_false>::
  TraceFixedFieldsAfterTypeHandlerChange
            (instance,(DynamicTypeHandler *)this,(DynamicTypeHandler *)this_02,oldType,
             oldSingletonInstanceBefore);
  return this_02;
}

Assistant:

U* SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::ConvertToTypeHandler(DynamicObject* instance)
    {
        ScriptContext* scriptContext = instance->GetScriptContext();
        Recycler* recycler = scriptContext->GetRecycler();

        U* newTypeHandler = RecyclerNew(recycler, U, recycler, GetSlotCapacity(), GetInlineSlotCapacity(), GetOffsetOfInlineSlots());
        // We expect the new type handler to start off marked as having only writable data properties.
        Assert(newTypeHandler->GetHasOnlyWritableDataProperties());

#if ENABLE_FIXED_FIELDS
#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        DynamicType* oldType = instance->GetDynamicType();
        RecyclerWeakReference<DynamicObject>* oldSingletonInstance = GetSingletonInstance();
        TraceFixedFieldsBeforeTypeHandlerChange(_u("SimpleDictionaryTypeHandler"), _u("[Simple]DictionaryTypeHandler"), instance, this, oldType, oldSingletonInstance);
#endif

        bool const canBeSingletonInstance = DynamicTypeHandler::CanBeSingletonInstance(instance);
        // If this type had been installed on a stack instance it shouldn't have a singleton Instance
        Assert(canBeSingletonInstance || !this->HasSingletonInstance());

        if (canBeSingletonInstance)
        {
            // We assume the new type handler is not shared.  Hence it's ok to set this instance as the handler's singleton instance.
            Assert(HasSingletonInstanceOnlyIfNeeded());
            if (AreSingletonInstancesNeeded())
            {
                RecyclerWeakReference<DynamicObject>* curSingletonInstance = this->singletonInstance;
                if (curSingletonInstance != nullptr && curSingletonInstance->Get() == instance)
                {
                    newTypeHandler->SetSingletonInstance(curSingletonInstance);
                }
                else
                {
                    newTypeHandler->SetSingletonInstance(instance->CreateWeakReferenceToSelf());
                }
            }
        }

        // If we are a prototype or may become a prototype we must transfer used as fixed bits.
        // See point 4 in PathTypeHandlerBase::ConvertToSimpleDictionaryType.
        bool isGlobalObject = instance->GetTypeId() == TypeIds_GlobalObject;
        bool isTypeLocked = instance->GetDynamicType()->GetIsLocked();
        bool isOrMayBecomeShared = GetIsOrMayBecomeShared();
        Assert(!isOrMayBecomeShared || !IsolatePrototypes() || ((this->GetFlags() & IsPrototypeFlag) == 0));
        // For the global object we don't emit a type check before a hard-coded use of a fixed field. Therefore a type transition isn't sufficient to
        // invalidate any used fixed fields, and we must continue tracking them on the new type handler. If the type isn't locked, we may not change the
        // type of the instance, and we must also track the used fixed fields on the new handler.
        bool transferUsedAsFixed = isGlobalObject || !isTypeLocked || ((this->GetFlags() & IsPrototypeFlag) != 0 || (isOrMayBecomeShared && !IsolatePrototypes())) || PHASE_FORCE1(Js::FixDataPropsPhase);
#endif

        SimpleDictionaryPropertyDescriptor<TPropertyIndex> descriptor;
        TMapKey propertyKey;
        for (int i = 0; i < propertyMap->Count(); i++)
        {
            descriptor = propertyMap->GetValueAt(i);
            propertyKey = propertyMap->GetKeyAt(i);

            // newTH->nextPropertyIndex will be less than desc.propertyIndex, when we have function with same name parameters
            if (newTypeHandler->nextPropertyIndex < static_cast<typename U::PropertyIndexType>(descriptor.propertyIndex))
            {
                newTypeHandler->nextPropertyIndex = static_cast<typename U::PropertyIndexType>(descriptor.propertyIndex);
            }

            Assert(newTypeHandler->nextPropertyIndex == descriptor.propertyIndex);
#if ENABLE_FIXED_FIELDS
            Assert(!GetIsShared() || !descriptor.isFixed);
            newTypeHandler->Add(TMapKey_ConvertKey<UMapKey>(scriptContext, propertyKey), descriptor.Attributes, descriptor.isInitialized, descriptor.isFixed, transferUsedAsFixed && descriptor.usedAsFixed, scriptContext);
#else
            newTypeHandler->Add(TMapKey_ConvertKey<UMapKey>(scriptContext, propertyKey), descriptor.Attributes, true, false, false, scriptContext);
#endif
        }

        newTypeHandler->nextPropertyIndex = static_cast<typename U::PropertyIndexType>(nextPropertyIndex);
        newTypeHandler->SetNumDeletedProperties(numDeletedProperties);

#if ENABLE_FIXED_FIELDS
        ClearSingletonInstance();
#endif

        AssertMsg((newTypeHandler->GetFlags() & IsPrototypeFlag) == 0, "Why did we create a brand new type handler with a prototype flag set?");
        newTypeHandler->SetFlags(IsPrototypeFlag, this->GetFlags());
        newTypeHandler->ChangeFlags(IsExtensibleFlag | IsSealedOnceFlag | IsFrozenOnceFlag, this->GetFlags());
        // Any new type handler we expect to see here should have inline slot capacity locked.  If this were to change, we would need
        // to update our shrinking logic (see PathTypeHandlerBase::ShrinkSlotAndInlineSlotCapacity).
        Assert(newTypeHandler->GetIsInlineSlotCapacityLocked());
        newTypeHandler->SetPropertyTypes(PropertyTypesWritableDataOnly | PropertyTypesWritableDataOnlyDetection | PropertyTypesHasSpecialProperties, this->GetPropertyTypes());
        newTypeHandler->SetInstanceTypeHandler(instance);
#if ENABLE_FIXED_FIELDS
        // We assumed that we don't need to transfer used as fixed bits unless we are a prototype, which is only valid if we also changed the type.
        Assert(transferUsedAsFixed || (instance->GetType() != oldType && oldType->GetTypeId() != TypeIds_GlobalObject));
        Assert(!newTypeHandler->HasSingletonInstance() || !instance->HasSharedType());

#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        TraceFixedFieldsAfterTypeHandlerChange(instance, this, newTypeHandler, oldType, oldSingletonInstance);
#endif
#endif
        return newTypeHandler;
    }